

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::ImageDataParameter::InternalSerializeWithCachedSizesToArray
          (ImageDataParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  char *pcVar5;
  string *psVar6;
  UnknownFieldSet *unknown_fields;
  float value;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  ImageDataParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 1) != 0) {
    source_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    source_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.ImageDataParameter.source");
    psVar6 = source_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray(1,psVar6,target);
  }
  if ((uVar1 & 0x400) != 0) {
    value = scale(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(2,value,puStack_40);
  }
  if ((uVar1 & 2) != 0) {
    mean_file_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    mean_file_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.ImageDataParameter.mean_file");
    psVar6 = mean_file_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,psVar6,puStack_40)
    ;
  }
  if ((uVar1 & 0x800) != 0) {
    uVar4 = batch_size(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4,uVar4,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    uVar4 = crop_size(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5,uVar4,puStack_40);
  }
  if ((uVar1 & 0x40) != 0) {
    bVar2 = mirror(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(6,bVar2,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    uVar4 = rand_skip(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7,uVar4,puStack_40);
  }
  if ((uVar1 & 0x20) != 0) {
    bVar2 = shuffle(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(8,bVar2,puStack_40);
  }
  if ((uVar1 & 0x80) != 0) {
    uVar4 = new_height(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9,uVar4,puStack_40);
  }
  if ((uVar1 & 0x100) != 0) {
    uVar4 = new_width(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10,uVar4,puStack_40)
    ;
  }
  if ((uVar1 & 0x200) != 0) {
    bVar2 = is_color(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0xb,bVar2,puStack_40);
  }
  if ((uVar1 & 4) != 0) {
    root_folder_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    root_folder_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.ImageDataParameter.root_folder");
    psVar6 = root_folder_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray
                           (0xc,psVar6,puStack_40);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ImageDataParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* ImageDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ImageDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->source(), target);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->scale(), target);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.mean_file");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->mean_file(), target);
  }

  // optional uint32 batch_size = 4 [default = 1];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(4, this->batch_size(), target);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5, this->crop_size(), target);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->mirror(), target);
  }

  // optional uint32 rand_skip = 7 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7, this->rand_skip(), target);
  }

  // optional bool shuffle = 8 [default = false];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(8, this->shuffle(), target);
  }

  // optional uint32 new_height = 9 [default = 0];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->new_height(), target);
  }

  // optional uint32 new_width = 10 [default = 0];
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->new_width(), target);
  }

  // optional bool is_color = 11 [default = true];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(11, this->is_color(), target);
  }

  // optional string root_folder = 12 [default = ""];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->root_folder().data(), this->root_folder().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.ImageDataParameter.root_folder");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        12, this->root_folder(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ImageDataParameter)
  return target;
}